

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ActivationParams::MergePartialFromCodedStream
          (ActivationParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  ActivationSoftsign *this_00;
  ulong extraout_RAX;
  ActivationLeakyReLU *this_01;
  ulong extraout_RAX_00;
  ActivationSigmoidHard *this_02;
  ulong extraout_RAX_01;
  ActivationTanh *this_03;
  ulong extraout_RAX_02;
  ActivationParametricSoftplus *this_04;
  ulong extraout_RAX_03;
  ActivationELU *this_05;
  ulong extraout_RAX_04;
  ActivationSoftplus *this_06;
  ulong extraout_RAX_05;
  ActivationScaledTanh *this_07;
  ulong extraout_RAX_06;
  ActivationSigmoid *this_08;
  ulong extraout_RAX_07;
  ActivationLinear *this_09;
  ulong extraout_RAX_08;
  ActivationThresholdedReLU *this_10;
  ulong extraout_RAX_09;
  ActivationReLU *this_11;
  ulong extraout_RAX_10;
  ActivationPReLU *this_12;
  ulong extraout_RAX_11;
  char cVar7;
  ulong uVar8;
  int local_34;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_001f3532;
        uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_001f3532:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto LAB_001f301d;
    uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar8;
    if (uVar5 < 0x1f) {
      if (uVar5 < 0x14) {
        if (uVar5 == 5) {
          if (cVar7 == '*') {
            if (this->_oneof_case_[0] != 5) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 5;
              this_09 = (ActivationLinear *)operator_new(0x20);
              ActivationLinear::ActivationLinear(this_09);
              (this->NonlinearityType_).linear_ = this_09;
            }
            MergePartialFromCodedStream();
            uVar8 = extraout_RAX_08;
            goto LAB_001f3521;
          }
        }
        else if (uVar5 == 10) {
          if (cVar7 == 'R') {
            if (this->_oneof_case_[0] != 10) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 10;
              this_11 = (ActivationReLU *)operator_new(0x18);
              ActivationReLU::ActivationReLU(this_11);
              (this->NonlinearityType_).relu_ = this_11;
            }
            MergePartialFromCodedStream();
            uVar8 = extraout_RAX_10;
            goto LAB_001f3521;
          }
        }
        else if ((uVar5 == 0xf) && (cVar7 == 'z')) {
          if (this->_oneof_case_[0] != 0xf) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0xf;
            this_01 = (ActivationLeakyReLU *)operator_new(0x18);
            ActivationLeakyReLU::ActivationLeakyReLU(this_01);
            (this->NonlinearityType_).leakyrelu_ = this_01;
          }
          MergePartialFromCodedStream();
          uVar8 = extraout_RAX_00;
          goto LAB_001f3521;
        }
      }
      else if (uVar5 == 0x14) {
        if (cVar7 == -0x5e) {
          if (this->_oneof_case_[0] != 0x14) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x14;
            this_10 = (ActivationThresholdedReLU *)operator_new(0x18);
            ActivationThresholdedReLU::ActivationThresholdedReLU(this_10);
            (this->NonlinearityType_).thresholdedrelu_ = this_10;
          }
          MergePartialFromCodedStream();
          uVar8 = extraout_RAX_09;
          goto LAB_001f3521;
        }
      }
      else if (uVar5 == 0x19) {
        if (cVar7 == -0x36) {
          if (this->_oneof_case_[0] != 0x19) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x19;
            this_12 = (ActivationPReLU *)operator_new(0x20);
            ActivationPReLU::ActivationPReLU(this_12);
            (this->NonlinearityType_).prelu_ = this_12;
          }
          MergePartialFromCodedStream();
          uVar8 = extraout_RAX_11;
          goto LAB_001f3521;
        }
      }
      else if ((uVar5 == 0x1e) && (cVar7 == -0xe)) {
        if (this->_oneof_case_[0] != 0x1e) {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 0x1e;
          this_03 = (ActivationTanh *)operator_new(0x18);
          ActivationTanh::ActivationTanh(this_03);
          (this->NonlinearityType_).tanh_ = this_03;
        }
        MergePartialFromCodedStream();
        uVar8 = extraout_RAX_02;
        goto LAB_001f3521;
      }
LAB_001f301d:
      local_34 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        if (bVar4) {
LAB_001f3046:
          local_34 = 0;
        }
        else {
          local_34 = 6;
        }
      }
    }
    else {
      if (uVar5 < 0x32) {
        if (uVar5 == 0x1f) {
          if (cVar7 == -6) {
            if (this->_oneof_case_[0] != 0x1f) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x1f;
              this_07 = (ActivationScaledTanh *)operator_new(0x20);
              ActivationScaledTanh::ActivationScaledTanh(this_07);
              (this->NonlinearityType_).scaledtanh_ = this_07;
            }
            MergePartialFromCodedStream();
            uVar8 = extraout_RAX_06;
            goto LAB_001f3521;
          }
        }
        else if (uVar5 == 0x28) {
          if (cVar7 == 'B') {
            if (this->_oneof_case_[0] != 0x28) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x28;
              this_08 = (ActivationSigmoid *)operator_new(0x18);
              ActivationSigmoid::ActivationSigmoid(this_08);
              (this->NonlinearityType_).sigmoid_ = this_08;
            }
            MergePartialFromCodedStream();
            uVar8 = extraout_RAX_07;
            goto LAB_001f3521;
          }
        }
        else if ((uVar5 == 0x29) && (cVar7 == 'J')) {
          if (this->_oneof_case_[0] != 0x29) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x29;
            this_02 = (ActivationSigmoidHard *)operator_new(0x20);
            ActivationSigmoidHard::ActivationSigmoidHard(this_02);
            (this->NonlinearityType_).sigmoidhard_ = this_02;
          }
          MergePartialFromCodedStream();
          uVar8 = extraout_RAX_01;
          goto LAB_001f3521;
        }
        goto LAB_001f301d;
      }
      if (0x45 < uVar5) {
        if (uVar5 == 0x46) {
          if (cVar7 == '2') {
            if (this->_oneof_case_[0] != 0x46) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x46;
              this_06 = (ActivationSoftplus *)operator_new(0x18);
              ActivationSoftplus::ActivationSoftplus(this_06);
              (this->NonlinearityType_).softplus_ = this_06;
            }
            MergePartialFromCodedStream();
            uVar8 = extraout_RAX_05;
            goto LAB_001f3521;
          }
        }
        else if ((uVar5 == 0x47) && (cVar7 == ':')) {
          if (this->_oneof_case_[0] != 0x47) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x47;
            this_04 = (ActivationParametricSoftplus *)operator_new(0x28);
            ActivationParametricSoftplus::ActivationParametricSoftplus(this_04);
            (this->NonlinearityType_).parametricsoftplus_ = this_04;
          }
          MergePartialFromCodedStream();
          uVar8 = extraout_RAX_03;
          goto LAB_001f3521;
        }
        goto LAB_001f301d;
      }
      if (uVar5 == 0x32) {
        if (cVar7 == -0x6e) {
          if (this->_oneof_case_[0] != 0x32) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x32;
            this_05 = (ActivationELU *)operator_new(0x18);
            ActivationELU::ActivationELU(this_05);
            (this->NonlinearityType_).elu_ = this_05;
          }
          MergePartialFromCodedStream();
          uVar8 = extraout_RAX_04;
          goto LAB_001f3521;
        }
        goto LAB_001f301d;
      }
      if ((uVar5 != 0x3c) || (cVar7 != -0x1e)) goto LAB_001f301d;
      if (this->_oneof_case_[0] != 0x3c) {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x3c;
        this_00 = (ActivationSoftsign *)operator_new(0x18);
        ActivationSoftsign::ActivationSoftsign(this_00);
        (this->NonlinearityType_).softsign_ = this_00;
      }
      MergePartialFromCodedStream();
      uVar8 = extraout_RAX;
LAB_001f3521:
      if ((uVar8 & 1) == 0) goto LAB_001f3046;
      local_34 = (int)((ulong)in_RAX >> 0x20);
    }
    if (local_34 != 0) {
      return local_34 != 6;
    }
  } while( true );
}

Assistant:

bool ActivationParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ActivationParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.ActivationLinear linear = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linear()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationReLU ReLU = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_relu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationLeakyReLU leakyReLU = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_leakyrelu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationThresholdedReLU thresholdedReLU = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_thresholdedrelu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationPReLU PReLU = 25;
      case 25: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_prelu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationTanh tanh = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tanh()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationScaledTanh scaledTanh = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scaledtanh()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSigmoid sigmoid = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSigmoidHard sigmoidHard = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(330u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoidhard()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationELU ELU = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_elu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSoftsign softsign = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softsign()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSoftplus softplus = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(562u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softplus()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationParametricSoftplus parametricSoftplus = 71;
      case 71: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(570u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_parametricsoftplus()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ActivationParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ActivationParams)
  return false;
#undef DO_
}